

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall google::protobuf::Message::Utf8DebugString_abi_cxx11_(Message *this)

{
  Printer *in_RDI;
  Printer printer;
  string *debug_string;
  Printer *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff8f;
  Printer *in_stack_ffffffffffffff90;
  _Base_ptr in_stack_ffffffffffffffc0;
  _Base_ptr in_stack_ffffffffffffffc8;
  Printer *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)in_RDI);
  TextFormat::Printer::Printer(in_stack_ffffffffffffff60);
  TextFormat::Printer::SetUseUtf8StringEscaping
            (in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  TextFormat::Printer::SetExpandAny((Printer *)&stack0xffffffffffffff60,true);
  TextFormat::Printer::PrintToString
            (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8,
             (string *)in_stack_ffffffffffffffc0);
  TextFormat::Printer::~Printer(in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string Message::Utf8DebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetUseUtf8StringEscaping(true);
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}